

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::TextGenerator
          (TextGenerator *this,ZeroCopyOutputStream *output,int initial_indent_level)

{
  this->output_ = output;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->at_start_of_line_ = true;
  this->failed_ = false;
  (this->indent_)._M_dataplus._M_p = (pointer)&(this->indent_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->indent_,"");
  this->initial_indent_level_ = initial_indent_level;
  std::__cxx11::string::resize((ulong)&this->indent_,(char)initial_indent_level * '\x02');
  return;
}

Assistant:

explicit TextGenerator(io::ZeroCopyOutputStream* output,
                         int initial_indent_level)
    : output_(output),
      buffer_(NULL),
      buffer_size_(0),
      at_start_of_line_(true),
      failed_(false),
      indent_(""),
      initial_indent_level_(initial_indent_level) {
    indent_.resize(initial_indent_level_ * 2, ' ');
  }